

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.hpp
# Opt level: O2

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,shared_ptr<Readable> *reader)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int local_18 [4];
  
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  this->sourceIndex = 0;
  this->sourceLine = 1;
  this->sourceColumn = 1;
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  std::make_shared<Token,char_const(&)[8],TokenType,int,int,int>
            ((char (*) [8])&this->token,(TokenType *)"Unknown",local_18,local_18 + 1,local_18 + 2);
  return;
}

Assistant:

explicit Tokenizer(std::shared_ptr<Readable> reader) noexcept
  : reader{std::move(reader)},
    sourceIndex{0},
    sourceLine{1},
    sourceColumn{1},
    token{std::make_shared<Token>("Unknown", TokenType::Unknown, 0, 0, 0)}
  {}